

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getFirstComponentName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VarType *type)

{
  uint uVar1;
  SubTypeAccess *pSVar2;
  ostringstream buff;
  SubTypeAccess SStack_1c8;
  TypeAccessFormat local_198;
  ostream local_188;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  uVar1 = *(uint *)(this + 8);
  if ((((ulong)uVar1 < 0x23) && ((0x77003801cU >> ((ulong)uVar1 & 0x3f) & 1) != 0)) ||
     (uVar1 - 0x24 < 3)) {
    glu::SubTypeAccess::SubTypeAccess(&SStack_1c8,(VarType *)this);
    pSVar2 = glu::SubTypeAccess::component(&SStack_1c8,0);
    local_198.path = &pSVar2->m_path;
    local_198.type = (VarType *)this;
    glu::operator<<(&local_188,&local_198);
  }
  else {
    if (8 < uVar1 - 5 && 8 < uVar1 - 0x12) goto LAB_012ccf81;
    glu::SubTypeAccess::SubTypeAccess(&SStack_1c8,(VarType *)this);
    pSVar2 = glu::SubTypeAccess::column(&SStack_1c8,0);
    pSVar2 = glu::SubTypeAccess::component(pSVar2,0);
    local_198.path = &pSVar2->m_path;
    local_198.type = (VarType *)this;
    glu::operator<<(&local_188,&local_198);
  }
  glu::SubTypeAccess::~SubTypeAccess(&SStack_1c8);
LAB_012ccf81:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  return __return_storage_ptr__;
}

Assistant:

string getFirstComponentName (const glu::VarType& type)
{
	std::ostringstream buff;
	if (glu::isDataTypeVector(type.getBasicType()))
		buff << glu::TypeAccessFormat(type, glu::SubTypeAccess(type).component(0).getPath());
	else if (glu::isDataTypeMatrix(type.getBasicType()))
		buff << glu::TypeAccessFormat(type, glu::SubTypeAccess(type).column(0).component(0).getPath());

	return buff.str();
}